

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

bool google::protobuf::internal::anon_unknown_0::ParsingEndsInBuffer(char *ptr,char *end,int depth)

{
  uint32_t uVar1;
  int32_t size;
  uint64_t val;
  uint32_t tag;
  int depth_local;
  char *end_local;
  char *ptr_local;
  
  val._4_4_ = depth;
  _tag = end;
  end_local = ptr;
  while( true ) {
    if (_tag <= end_local) {
      return false;
    }
    end_local = ReadTag(end_local,(uint32_t *)&val,0);
    if ((end_local == (char *)0x0) || (_tag < end_local)) break;
    if ((uint)val == 0) {
      return true;
    }
    switch((uint)val & 7) {
    case 0:
      end_local = VarintParse<unsigned_long>(end_local,(unsigned_long *)&stack0xffffffffffffffd0);
      if (end_local == (char *)0x0) {
        return false;
      }
      break;
    case 1:
      end_local = end_local + 8;
      break;
    case 2:
      uVar1 = ReadSize(&end_local);
      if ((end_local == (char *)0x0) || ((long)_tag - (long)end_local < (long)(int)uVar1)) {
        return false;
      }
      end_local = end_local + (int)uVar1;
      break;
    case 3:
      val._4_4_ = val._4_4_ + 1;
      break;
    case 4:
      val._4_4_ = val._4_4_ + -1;
      if (val._4_4_ < 0) {
        return true;
      }
      break;
    case 5:
      end_local = end_local + 4;
      break;
    default:
      return false;
    }
  }
  return false;
}

Assistant:

bool ParsingEndsInBuffer(const char* ptr, const char* end, int depth) {
  while (ptr < end) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    if (ptr == nullptr || ptr > end) return false;
    // ending on 0 tag is allowed and is the major reason for the necessity of
    // this function.
    if (tag == 0) return true;
    switch (tag & 7) {
      case 0: {  // Varint
        uint64_t val;
        ptr = VarintParse(ptr, &val);
        if (ptr == nullptr) return false;
        break;
      }
      case 1: {  // fixed64
        ptr += 8;
        break;
      }
      case 2: {  // len delim
        int32_t size = ReadSize(&ptr);
        if (ptr == nullptr || size > end - ptr) return false;
        ptr += size;
        break;
      }
      case 3: {  // start group
        depth++;
        break;
      }
      case 4: {                    // end group
        if (--depth < 0) return true;  // We exit early
        break;
      }
      case 5: {  // fixed32
        ptr += 4;
        break;
      }
      default:
        return false;  // Unknown wireformat
    }
  }
  return false;
}